

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O3

WebPInfoStatus ParseLosslessHeader(ChunkData *chunk_data,WebPInfo *webp_info)

{
  uint8_t *data;
  WebPInfoStatus WVar1;
  undefined1 *puVar2;
  ulong uVar3;
  byte bVar4;
  int iVar5;
  uint64_t p;
  long lVar6;
  WebPInfo *in_RDX;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined1 *data_size;
  uint64_t local_38;
  
  puts("  Parsing lossless bitstream...");
  if (&chunk_data[-1].id < (ChunkID *)0x5) {
    WVar1 = WEBP_INFO_TRUNCATED_DATA;
    if (in_RDX->show_diagnosis != 0) {
      ParseLosslessHeader_cold_5();
    }
  }
  else if ((char)webp_info->canvas_width == '/') {
    data = (uint8_t *)((long)&webp_info->canvas_width + 1);
    data_size = (undefined1 *)((long)&chunk_data[-1].payload + 7);
    uVar8 = 0;
    uVar3 = 0;
    do {
      puVar2 = (undefined1 *)(uVar3 >> 3);
      if (data_size <= puVar2) {
        if (in_RDX->show_diagnosis == 0) {
          return WEBP_INFO_TRUNCATED_DATA;
        }
        ParseLosslessHeader_cold_2();
        return WEBP_INFO_TRUNCATED_DATA;
      }
      uVar7 = (uint)uVar3;
      bVar4 = (byte)uVar3;
      uVar3 = uVar3 + 1;
      uVar8 = uVar8 | (uint)((data[(long)puVar2] >> (uVar7 & 7) & 1) != 0) << (bVar4 & 0x1f);
    } while (uVar3 != 0xe);
    iVar5 = 0;
    uVar7 = 0;
    uVar3 = 0xe;
    do {
      if (data_size <= (undefined1 *)(uVar3 >> 3)) {
        if (in_RDX->show_diagnosis == 0) {
          return WEBP_INFO_TRUNCATED_DATA;
        }
        ParseLosslessHeader_cold_3();
        return WEBP_INFO_TRUNCATED_DATA;
      }
      uVar7 = uVar7 | (uint)((data[(long)(uVar3 >> 3)] >> ((uint)uVar3 & 7) & 1) != 0) <<
                      ((byte)iVar5 & 0x1f);
      iVar5 = iVar5 + 1;
      uVar3 = uVar3 + 1;
    } while (iVar5 != 0xe);
    iVar5 = webp_info->canvas_height;
    lVar6 = 0;
    uVar9 = 0;
    do {
      puVar2 = (undefined1 *)(lVar6 + 0x1dU >> 3);
      if (data_size <= puVar2) {
        if (in_RDX->show_diagnosis == 0) {
          return WEBP_INFO_TRUNCATED_DATA;
        }
        ParseLosslessHeader_cold_4();
        return WEBP_INFO_TRUNCATED_DATA;
      }
      uVar9 = uVar9 | (uint)((data[(long)puVar2] >> ((int)lVar6 + 5U & 0x1f) & 1) != 0) <<
                      ((byte)lVar6 & 0x1f);
      lVar6 = lVar6 + 1;
    } while ((int)lVar6 != 3);
    local_38 = 0x20;
    printf("  Width:            %d\n",(ulong)(uVar8 + 1));
    printf("  Height:           %d\n",(ulong)(uVar7 + 1));
    printf("  Alpha:            %d\n",(ulong)((byte)((byte)iVar5 >> 4) & 1));
    printf("  Version:          %d\n",(ulong)uVar9);
    WVar1 = ParseLosslessTransform(in_RDX,data,(size_t)data_size,&local_38);
  }
  else {
    WVar1 = WEBP_INFO_BITSTREAM_ERROR;
    if (in_RDX->show_diagnosis != 0) {
      ParseLosslessHeader_cold_1();
    }
  }
  return WVar1;
}

Assistant:

static WebPInfoStatus ParseLosslessHeader(const ChunkData* const chunk_data,
                                          WebPInfo* const webp_info) {
  const uint8_t* data = chunk_data->payload;
  size_t data_size = chunk_data->size - CHUNK_HEADER_SIZE;
  uint64_t bit_position = 0;
  uint64_t* const bit_pos = &bit_position;
  WebPInfoStatus status;
  printf("  Parsing lossless bitstream...\n");
  if (data_size < VP8L_FRAME_HEADER_SIZE) {
    LOG_ERROR("Truncated lossless bitstream.");
    return WEBP_INFO_TRUNCATED_DATA;
  }
  if (data[0] != VP8L_MAGIC_BYTE) {
    LOG_ERROR("Invalid lossless bitstream signature.");
    return WEBP_INFO_BITSTREAM_ERROR;
  }
  data += 1;
  data_size -= 1;
  {
    int width, height, has_alpha, version;
    LL_GET_BITS(width, 14);
    LL_GET_BITS(height, 14);
    LL_GET_BITS(has_alpha, 1);
    LL_GET_BITS(version, 3);
    width += 1;
    height += 1;
    printf("  Width:            %d\n", width);
    printf("  Height:           %d\n", height);
    printf("  Alpha:            %d\n", has_alpha);
    printf("  Version:          %d\n", version);
  }
  status = ParseLosslessTransform(webp_info, data, data_size, bit_pos);
  if (status != WEBP_INFO_OK) return status;
  return WEBP_INFO_OK;
}